

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageColorInvert(Image *image)

{
  int newFormat;
  Color *pCVar1;
  long lVar2;
  Image in_stack_00000000;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar1 = LoadImageColors(in_stack_00000000);
    if (0 < image->height * image->width) {
      lVar2 = 0;
      do {
        pCVar1[lVar2].r = ~pCVar1[lVar2].r;
        pCVar1[lVar2].g = ~pCVar1[lVar2].g;
        pCVar1[lVar2].b = ~pCVar1[lVar2].b;
        lVar2 = lVar2 + 1;
      } while (lVar2 < (long)image->height * (long)image->width);
    }
    newFormat = image->format;
    free(image->data);
    image->data = pCVar1;
    image->format = 7;
    ImageFormat(image,newFormat);
    return;
  }
  return;
}

Assistant:

void ImageColorInvert(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        pixels[i].r = 255 - pixels[i].r;
        pixels[i].g = 255 - pixels[i].g;
        pixels[i].b = 255 - pixels[i].b;
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}